

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

void __thiscall
pstore::sparse_array<(anonymous_namespace)::with_default_ctor,unsigned_long>::
sparse_array<unsigned_int_const*>
          (sparse_array<(anonymous_namespace)::with_default_ctor,unsigned_long> *this,
          uint *first_index,uint *last_index)

{
  unsigned_long uVar1;
  sparse_array<(anonymous_namespace)::with_default_ctor,unsigned_long> *local_30;
  sparse_array<(anonymous_namespace)::with_default_ctor,unsigned_long> *local_28;
  with_default_ctor *out;
  uint *last_index_local;
  uint *first_index_local;
  sparse_array<(anonymous_namespace)::with_default_ctor,_unsigned_long> *this_local;
  
  uVar1 = bitmap<unsigned_int_const*,void>(first_index,last_index);
  *(unsigned_long *)this = uVar1;
  local_30 = this + 8;
  do {
    anon_unknown.dwarf_92f3e::with_default_ctor::with_default_ctor((with_default_ctor *)local_30);
    local_30 = local_30 + 4;
  } while (local_30 != this + 0xc);
  last_index_local = first_index;
  if (first_index != last_index) {
    last_index_local = first_index + 1;
  }
  local_28 = this + 0xc;
  for (; last_index_local != last_index; last_index_local = last_index_local + 1) {
    memset(local_28,0,4);
    anon_unknown.dwarf_92f3e::with_default_ctor::with_default_ctor((with_default_ctor *)local_28);
    local_28 = local_28 + 4;
  }
  return;
}

Assistant:

sparse_array<ValueType, BitmapType>::sparse_array (IteratorIdx first_index,
                                                       IteratorIdx last_index)
            : bitmap_{sparse_array<ValueType, BitmapType>::bitmap (first_index, last_index)} {
        // The first element will have been default-constructed by the compiler.
        if (first_index != last_index) {
            ++first_index;
        }
        auto * out = &elements_[1];
        // Default-construct the remaining objects.
        for (; first_index != last_index; ++first_index, ++out) {
            new (out) ValueType ();
        }
    }